

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::javanano::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  string *str;
  bool bVar1;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  string *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,".protodevel",&local_39);
  bVar1 = HasSuffixString(filename,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  str = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,".protodevel",&local_71);
    StripSuffixString(__return_storage_ptr__,str,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,".proto",&local_99);
    StripSuffixString(__return_storage_ptr__,str,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}